

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::get_ip_and_port
               (sockaddr_storage *addr,socklen_t addr_len,string *ip,int *port)

{
  uint16_t uVar1;
  int iVar2;
  pointer pvVar3;
  size_type sVar4;
  uint *in_RCX;
  string *in_RDX;
  socklen_t in_ESI;
  sockaddr *in_RDI;
  array<char,_1025UL> ipstr;
  array<char,_1025UL> local_429;
  uint *local_28;
  string *local_20;
  socklen_t local_14;
  sockaddr *local_10;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (in_RDI->sa_family == 2) {
    uVar1 = ntohs(*(uint16_t *)in_RDI->sa_data);
    *local_28 = (uint)uVar1;
  }
  else {
    if (in_RDI->sa_family != 10) {
      return false;
    }
    uVar1 = ntohs(*(uint16_t *)in_RDI->sa_data);
    *local_28 = (uint)uVar1;
  }
  memset(&local_429,0,0x401);
  pvVar3 = std::array<char,_1025UL>::data((array<char,_1025UL> *)0x218608);
  sVar4 = std::array<char,_1025UL>::size(&local_429);
  iVar2 = getnameinfo(local_10,local_14,pvVar3,(socklen_t)sVar4,(char *)0x0,0,1);
  if (iVar2 == 0) {
    pvVar3 = std::array<char,_1025UL>::data((array<char,_1025UL> *)0x218654);
    ::std::__cxx11::string::operator=(local_20,pvVar3);
  }
  return iVar2 == 0;
}

Assistant:

inline bool get_ip_and_port(const struct sockaddr_storage &addr,
                            socklen_t addr_len, std::string &ip, int &port) {
  if (addr.ss_family == AF_INET) {
    port = ntohs(reinterpret_cast<const struct sockaddr_in *>(&addr)->sin_port);
  } else if (addr.ss_family == AF_INET6) {
    port =
        ntohs(reinterpret_cast<const struct sockaddr_in6 *>(&addr)->sin6_port);
  } else {
    return false;
  }

  std::array<char, NI_MAXHOST> ipstr{};
  if (getnameinfo(reinterpret_cast<const struct sockaddr *>(&addr), addr_len,
                  ipstr.data(), static_cast<socklen_t>(ipstr.size()), nullptr,
                  0, NI_NUMERICHOST)) {
    return false;
  }

  ip = ipstr.data();
  return true;
}